

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ia5.cc
# Opt level: O0

char * i2s_ASN1_IA5STRING(X509V3_EXT_METHOD *method,void *ext)

{
  char *tmp;
  ASN1_IA5STRING *ia5;
  void *ext_local;
  X509V3_EXT_METHOD *method_local;
  
  if ((ext == (void *)0x0) || (*ext == 0)) {
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    method_local = (X509V3_EXT_METHOD *)OPENSSL_malloc((long)(*ext + 1));
    if (method_local == (X509V3_EXT_METHOD *)0x0) {
      method_local = (X509V3_EXT_METHOD *)0x0;
    }
    else {
      OPENSSL_memcpy(method_local,*(void **)((long)ext + 8),(long)*ext);
      *(undefined1 *)((long)&method_local->ext_nid + (long)*ext) = 0;
    }
  }
  return (char *)method_local;
}

Assistant:

static char *i2s_ASN1_IA5STRING(const X509V3_EXT_METHOD *method, void *ext) {
  const ASN1_IA5STRING *ia5 = reinterpret_cast<const ASN1_IA5STRING *>(ext);
  char *tmp;
  if (!ia5 || !ia5->length) {
    return NULL;
  }
  if (!(tmp = reinterpret_cast<char *>(OPENSSL_malloc(ia5->length + 1)))) {
    return NULL;
  }
  OPENSSL_memcpy(tmp, ia5->data, ia5->length);
  tmp[ia5->length] = 0;
  return tmp;
}